

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O1

Orphan<capnproto_test::capnp::test::TestDefaults> * __thiscall
capnp::Orphan<capnp::DynamicValue>::releaseAs<capnproto_test::capnp::test::TestDefaults>
          (Orphan<capnproto_test::capnp::test::TestDefaults> *__return_storage_ptr__,
          Orphan<capnp::DynamicValue> *this)

{
  Builder BStack_88;
  BuilderFor<DynamicStruct> local_48;
  
  get(&BStack_88,this);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_48,&BStack_88);
  Schema::requireUsableAs((Schema *)&local_48,(RawSchema *)schemas::s_eb3f9ebe98c73cb6);
  DynamicValue::Builder::~Builder(&BStack_88);
  this->type = UNKNOWN;
  (__return_storage_ptr__->builder).segment = (this->builder).segment;
  (__return_storage_ptr__->builder).capTable = (this->builder).capTable;
  (__return_storage_ptr__->builder).location = (this->builder).location;
  (__return_storage_ptr__->builder).tag.content = (this->builder).tag.content;
  (this->builder).segment = (SegmentBuilder *)0x0;
  (this->builder).location = (word *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Orphan<T> Orphan<DynamicValue>::releaseAs() {
  get().as<T>();  // type check
  type = DynamicValue::UNKNOWN;
  return Orphan<T>(kj::mv(builder));
}